

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O0

bool __thiscall
Js::SourceDynamicProfileManager::LoadFromProfileCache
          (SourceDynamicProfileManager *this,SimpleDataCacheWrapper *dataCacheWrapper,LPCWSTR url)

{
  LPCWSTR url_local;
  SimpleDataCacheWrapper *dataCacheWrapper_local;
  SourceDynamicProfileManager *this_local;
  
  return false;
}

Assistant:

bool SourceDynamicProfileManager::LoadFromProfileCache(SimpleDataCacheWrapper* dataCacheWrapper, LPCWSTR url)
    {
#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
        AssertMsg(CONFIG_FLAG(WininetProfileCache), "Profile caching should be enabled for us to get here");
        Assert(dataCacheWrapper);
        AssertMsg(!IsProfileLoadedFromWinInet(), "Duplicate profile cache loading?");

        // Keep a copy of this
        this->dataCacheWrapper = dataCacheWrapper;
        HRESULT hr = dataCacheWrapper->SeekReadStreamToBlock(SimpleDataCacheWrapper::BlockType_ProfileData);
        if(SUCCEEDED(hr))
        {
            uint numberOfFunctions = 0;
            if (FAILED(dataCacheWrapper->Read(&numberOfFunctions)) || numberOfFunctions > MAX_FUNCTION_COUNT)
            {
                return false;
            }
            BVFixed* functions = BVFixed::New(numberOfFunctions, this->recycler);
            if (FAILED(dataCacheWrapper->ReadArray(functions->GetData(), functions->WordCount())))
            {
                return false;
            }
            this->cachedStartupFunctions = functions;
            OUTPUT_TRACE(Js::DynamicProfilePhase, _u("Profile load succeeded. Function count: %d  %s\n"), numberOfFunctions, url);
#if DBG_DUMP
            if(PHASE_TRACE1(Js::DynamicProfilePhase) && Js::Configuration::Global.flags.Verbose)
            {
                OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Profile loaded:\n"));
                functions->Dump();
            }
#endif
            return true;
        }
        else if (hr == HRESULT_FROM_WIN32(ERROR_WRITE_PROTECT))
        {
            this->isNonCachableScript = true;
            OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Profile load failed. Non-cacheable resource. %s\n"), url);
        }
        else
        {
            OUTPUT_TRACE(Js::DynamicProfilePhase, _u("Profile load failed. No read stream. %s\n"), url);
        }
#endif
        return false;
    }